

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::setOrder(ConfigData *config,string *order)

{
  bool bVar1;
  byte bVar2;
  runtime_error *this;
  long in_RDI;
  undefined7 in_stack_fffffffffffffef0;
  allocator *__lhs;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  string *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [40];
  long local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"declared",&local_31);
  bVar1 = startsWith(in_stack_ffffffffffffff28,
                     (string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (bVar1) {
    *(undefined4 *)(local_8 + 0x20) = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"lexical",&local_69);
    bVar1 = startsWith(in_stack_ffffffffffffff28,
                       (string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (bVar1) {
      *(undefined4 *)(local_8 + 0x20) = 1;
    }
    else {
      __lhs = &local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"random",__lhs);
      bVar2 = startsWith(in_stack_ffffffffffffff28,
                         (string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      if ((bVar2 & 1) == 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)CONCAT17(bVar2,in_stack_fffffffffffffef0));
        std::runtime_error::runtime_error(this,local_b8);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(undefined4 *)(local_8 + 0x20) = 2;
    }
  }
  return;
}

Assistant:

inline void setOrder( ConfigData& config, std::string const& order ) {
        if( startsWith( "declared", order ) )
            config.runOrder = RunTests::InDeclarationOrder;
        else if( startsWith( "lexical", order ) )
            config.runOrder = RunTests::InLexicographicalOrder;
        else if( startsWith( "random", order ) )
            config.runOrder = RunTests::InRandomOrder;
        else
            throw std::runtime_error( "Unrecognised ordering: '" + order + "'" );
    }